

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O2

void R_InitColormaps(void)

{
  byte bVar1;
  BYTE BVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  BYTE *pBVar7;
  uint uVar8;
  uint uVar9;
  int c;
  long lVar10;
  DWORD i;
  int iVar11;
  BYTE *pBVar12;
  ulong uVar13;
  BYTE (*paBVar14) [256];
  int m;
  ulong uVar15;
  FakeCmap cm;
  FWadLump lump;
  char name [9];
  BYTE remap [256];
  BYTE mapin [256];
  
  R_DeinitColormaps();
  cm.name[0] = '\0';
  cm.blend.field_0 =
       (anon_union_4_2_12391d7c_for_PalEntry_0)
       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
  TArray<FakeCmap,_FakeCmap>::Push(&fakecmaps,&cm);
  iVar3 = FWadCollection::GetNumLumps(&Wads);
  for (iVar11 = 0; iVar3 != iVar11; iVar11 = iVar11 + 1) {
    iVar4 = FWadCollection::GetLumpNamespace(&Wads,iVar11);
    if (iVar4 == 3) {
      name[8] = '\0';
      FWadCollection::GetLumpName(&Wads,name,iVar11);
      iVar4 = FWadCollection::CheckNumForName(&Wads,name,3);
      if (iVar11 == iVar4) {
        strncpy(cm.name,name,8);
        cm.blend.field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)
             (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
        cm.lump = iVar11;
        TArray<FakeCmap,_FakeCmap>::Push(&fakecmaps,&cm);
      }
    }
  }
  realcolormaps = (BYTE *)operator_new__((ulong)(fakecmaps.Count << 0xd));
  R_SetDefaultColormap("COLORMAP");
  uVar5 = fakecmaps.Count;
  if (1 < fakecmaps.Count) {
    memcpy(remap,GPalette.Remap,0x100);
    memset(name,0,0x100);
    for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
      name[remap[lVar10]] = (char)lVar10;
    }
    remap[0] = '\0';
    for (uVar15 = 1; uVar15 < uVar5; uVar15 = uVar15 + 1) {
      iVar3 = FWadCollection::LumpLength(&Wads,fakecmaps.Array[uVar15].lump);
      if (0x20ff < iVar3) {
        uVar13 = (ulong)(uint)((int)uVar15 << 0xd);
        FWadCollection::OpenLumpNum(&lump,&Wads,fakecmaps.Array[uVar15].lump);
        pBVar7 = realcolormaps;
        pBVar12 = realcolormaps + uVar13;
        for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 1) {
          FWadLump::Read(&lump,mapin,0x100);
          pBVar7[lVar10 * 0x100 + (ulong)(uint)((int)uVar15 << 0xd)] = '\0';
          for (lVar6 = 1; lVar6 != 0x100; lVar6 = lVar6 + 1) {
            pBVar12[lVar6] = remap[mapin[(byte)name[lVar6]]];
          }
          pBVar12 = pBVar12 + 0x100;
        }
        uVar9 = 0;
        uVar8 = 0;
        uVar5 = 0;
        for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
          bVar1 = pBVar7[lVar10 + uVar13];
          uVar5 = uVar5 + GPalette.BaseColors[bVar1].field_0.field_0.r;
          uVar8 = uVar8 + GPalette.BaseColors[bVar1].field_0.field_0.g;
          uVar9 = uVar9 + GPalette.BaseColors[bVar1].field_0.field_0.b;
        }
        fakecmaps.Array[uVar15].blend.field_0.d =
             ((uVar5 & 0xff00) * 0x100 + (uVar9 >> 8 & 0xff | uVar8 & 0xff00)) - 0x1000000;
        FWadLump::~FWadLump(&lump);
      }
      uVar5 = fakecmaps.Count;
    }
  }
  pBVar12 = realcolormaps;
  pBVar7 = realfbcolormaps;
  if (realfbcolormaps == (BYTE *)0x0) {
    pBVar7 = (BYTE *)operator_new__((ulong)(uVar5 << 0xd));
    pBVar12 = realcolormaps;
    realfbcolormaps = pBVar7;
    memcpy(pBVar7,realcolormaps,(ulong)(uVar5 << 0xd));
  }
  NormalLight.Color.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0xffffff;
  NormalLight.Fade.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
  FullNormalLight.Color.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0xffffff;
  FullNormalLight.Fade.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
  NormalLight.Maps = pBVar12;
  FullNormalLight.Maps = pBVar7;
  memset(name,0,0x100);
  for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
    name[pBVar12[lVar10 + 0x1f00]] = name[pBVar12[lVar10 + 0x1f00]] + '\x01';
  }
  for (uVar8 = 0xff; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
    if ((byte)name[pBVar12[(ulong)uVar8 + 0x1f00]] < 0xb) {
      lVar10 = 0;
      do {
        if (lVar10 + 0x100 == 0x2000) goto LAB_003501a4;
        lVar6 = lVar10 + (ulong)uVar8;
        lVar10 = lVar10 + 0x100;
      } while (pBVar12[lVar6] == pBVar12[(ulong)uVar8 + 0x1f00]);
    }
  }
LAB_003501a4:
  NormalLightHasFixedLights = -1 < (int)uVar8;
  numfakecmaps = (size_t)uVar5;
  for (lVar10 = 0; lVar10 != 0x78; lVar10 = lVar10 + 0x18) {
    AddSpecialColormap(*(float *)((long)SpecialColormapParms[0].Start + lVar10),
                       *(float *)((long)SpecialColormapParms[0].Start + lVar10 + 4),
                       *(float *)((long)SpecialColormapParms[0].Start + lVar10 + 8),
                       *(float *)((long)SpecialColormapParms[0].End + lVar10),
                       *(float *)((long)SpecialColormapParms[0].End + lVar10 + 4),
                       *(float *)((long)SpecialColormapParms[0].End + lVar10 + 8));
  }
  paBVar14 = DesaturateColormap;
  for (lVar10 = 0; lVar10 != 0x1f; lVar10 = lVar10 + 1) {
    iVar3 = 0x1f - (int)lVar10;
    for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
      uVar5 = (uint)GPalette.BaseColors[lVar6].field_0.field_0.r;
      uVar9 = (uint)GPalette.BaseColors[lVar6].field_0.field_0.g;
      uVar8 = (uint)GPalette.BaseColors[lVar6].field_0.field_0.b;
      iVar11 = (uVar8 * 0x25 + uVar9 * 0x8f + uVar5 * 0x4d >> 8) * (int)lVar10;
      BVar2 = FColorMatcher::Pick(&ColorMatcher,(uVar5 * iVar3 + iVar11) / 0x1f,
                                  (uVar9 * iVar3 + iVar11) / 0x1f,(uVar8 * iVar3 + iVar11) / 0x1f);
      (*paBVar14)[lVar6] = BVar2;
    }
    paBVar14 = paBVar14 + 1;
  }
  return;
}

Assistant:

void R_InitColormaps ()
{
	// [RH] Try and convert BOOM colormaps into blending values.
	//		This is a really rough hack, but it's better than
	//		not doing anything with them at all (right?)

	FakeCmap cm;

	R_DeinitColormaps();

	cm.name[0] = 0;
	cm.blend = 0;
	fakecmaps.Push(cm);

	DWORD NumLumps = Wads.GetNumLumps();

	for (DWORD i = 0; i < NumLumps; i++)
	{
		if (Wads.GetLumpNamespace(i) == ns_colormaps)
		{
			char name[9];
			name[8] = 0;
			Wads.GetLumpName (name, i);

			if (Wads.CheckNumForName (name, ns_colormaps) == (int)i)
			{
				strncpy(cm.name, name, 8);
				cm.blend = 0;
				cm.lump = i;
				fakecmaps.Push(cm);
			}
		}
	}
	realcolormaps = new BYTE[256*NUMCOLORMAPS*fakecmaps.Size()];
	R_SetDefaultColormap ("COLORMAP");

	if (fakecmaps.Size() > 1)
	{
		BYTE unremap[256], remap[256], mapin[256];
		int i;
		unsigned j;

		memcpy (remap, GPalette.Remap, 256);
		memset (unremap, 0, 256);
		for (i = 0; i < 256; ++i)
		{
			unremap[remap[i]] = i;
		}
		remap[0] = 0;
		for (j = 1; j < fakecmaps.Size(); j++)
		{
			if (Wads.LumpLength (fakecmaps[j].lump) >= (NUMCOLORMAPS+1)*256)
			{
				int k, r, g, b;
				FWadLump lump = Wads.OpenLumpNum (fakecmaps[j].lump);
				BYTE *const map = realcolormaps + NUMCOLORMAPS*256*j;

				for (k = 0; k < NUMCOLORMAPS; ++k)
				{
					BYTE *map2 = &map[k*256];
					lump.Read (mapin, 256);
					map2[0] = 0;
					for (r = 1; r < 256; ++r)
					{
						map2[r] = remap[mapin[unremap[r]]];
					}
				}

				r = g = b = 0;

				for (k = 0; k < 256; k++)
				{
					r += GPalette.BaseColors[map[k]].r;
					g += GPalette.BaseColors[map[k]].g;
					b += GPalette.BaseColors[map[k]].b;
				}
				fakecmaps[j].blend = PalEntry (255, r/256, g/256, b/256);
			}
		}
	}

	// [SP] Create a copy of the colormap
	if (!realfbcolormaps)
	{
		realfbcolormaps = new BYTE[256*NUMCOLORMAPS*fakecmaps.Size()];
		memcpy(realfbcolormaps, realcolormaps, 256*NUMCOLORMAPS*fakecmaps.Size());
	}

	NormalLight.Color = PalEntry (255, 255, 255);
	NormalLight.Fade = 0;
	NormalLight.Maps = realcolormaps;
	FullNormalLight.Color = PalEntry (255, 255, 255);
	FullNormalLight.Fade = 0;
	FullNormalLight.Maps = realfbcolormaps;
	NormalLightHasFixedLights = R_CheckForFixedLights(realcolormaps);
	numfakecmaps = fakecmaps.Size();

	// build default special maps (e.g. invulnerability)

	for (unsigned i = 0; i < countof(SpecialColormapParms); ++i)
	{
		AddSpecialColormap(SpecialColormapParms[i].Start[0], SpecialColormapParms[i].Start[1],
			SpecialColormapParms[i].Start[2], SpecialColormapParms[i].End[0],
			SpecialColormapParms[i].End[1], SpecialColormapParms[i].End[2]);
	}
	// desaturated colormaps. These are used for texture composition
	for(int m = 0; m < 31; m++)
	{
		BYTE *shade = DesaturateColormap[m];
		for (int c = 0; c < 256; c++)
		{
			int intensity = (GPalette.BaseColors[c].r * 77 +
						GPalette.BaseColors[c].g * 143 +
						GPalette.BaseColors[c].b * 37) / 256;

			int r = (GPalette.BaseColors[c].r * (31-m) + intensity *m) / 31;
			int g = (GPalette.BaseColors[c].g * (31-m) + intensity *m) / 31;
			int b = (GPalette.BaseColors[c].b * (31-m) + intensity *m) / 31;
			shade[c] = ColorMatcher.Pick(r, g, b);
		}
	}
}